

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

size_t __thiscall
httplib::detail::MultipartFormDataParser::buf_find(MultipartFormDataParser *this,string *s)

{
  char cVar1;
  bool bVar2;
  ulong epos;
  size_t pos;
  size_t spos;
  
  cVar1 = *(s->_M_dataplus)._M_p;
  for (spos = this->buf_spos_; epos = this->buf_epos_, spos < epos; spos = spos + 1) {
    while( true ) {
      if (epos == spos) goto LAB_0013c26f;
      if ((this->buf_)._M_dataplus._M_p[spos] == cVar1) break;
      spos = spos + 1;
    }
    if ((epos - spos < s->_M_string_length) ||
       (bVar2 = start_with(this,&this->buf_,spos,epos,s), epos = spos, bVar2)) break;
  }
LAB_0013c26f:
  return epos - this->buf_spos_;
}

Assistant:

size_t buf_find(const std::string &s) const {
    auto c = s.front();

    size_t off = buf_spos_;
    while (off < buf_epos_) {
      auto pos = off;
      while (true) {
        if (pos == buf_epos_) { return buf_size(); }
        if (buf_[pos] == c) { break; }
        pos++;
      }

      auto remaining_size = buf_epos_ - pos;
      if (s.size() > remaining_size) { return buf_size(); }

      if (start_with(buf_, pos, buf_epos_, s)) { return pos - buf_spos_; }

      off = pos + 1;
    }

    return buf_size();
  }